

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# startup.cpp
# Opt level: O2

void init_scheme(void)

{
  time_t tVar1;
  ostream *poVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  allocator local_229;
  shared_ptr<SchemeObject> local_228;
  undefined1 local_218 [16];
  ParseResult x;
  ExecutionResult local_1d0;
  istringstream st;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [3];
  longlong local_168 [39];
  
  start_time = get_current_time();
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::__shared_ptr<SchemePort,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<SchemePort,(__gnu_cxx::_Lock_policy)2> *)&current_input_port,
             &default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<SchemePort,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<SchemePort,(__gnu_cxx::_Lock_policy)2> *)&current_output_port,
             &default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>);
  local_1a0[0]._M_allocated_capacity = 0;
  local_1a0[0]._M_local_buf[8] = '\0';
  _st = (pointer)&st;
  Context::operator=(&global_context,(Context *)&st);
  std::__cxx11::
  _List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
              *)&st);
  Context::new_frame(&global_context);
  global_context.toplevel = true;
  Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
  ::all();
  for (_Var3 = x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      _Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (_Var3._M_pi)->_vptr__Sp_counted_base) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
            *)&st,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
                   *)&(_Var3._M_pi)->_M_use_count);
    std::make_shared<SchemeSpecialForm,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_218._0_8_;
    local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Context::set(&global_context,(string *)&st,&local_228);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
             *)&st);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&x);
  Registry<std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
  ::all();
  for (_Var3 = x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      _Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (_Var3._M_pi)->_vptr__Sp_counted_base) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
            *)&st,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
                   *)&(_Var3._M_pi)->_M_use_count);
    std::make_shared<SchemePrimitiveProcedure,std::__cxx11::string_const&,long_long&,long_long&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (longlong *)&st,local_168);
    local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_218._0_8_;
    local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Context::set(&global_context,(string *)&st,&local_228);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
             *)&st);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&x);
  std::__cxx11::istringstream::istringstream((istringstream *)&st);
  std::__cxx11::stringbuf::str((string *)local_1a0[0]._M_local_buf);
  while( true ) {
    read_object(&x,(istream *)&st);
    if (x.result == END) {
      ParseResult::~ParseResult(&x);
      std::__cxx11::string::string((string *)&x,"console-i/o-port",(allocator *)local_218);
      std::__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SchemeFilePort,void>
                ((__shared_ptr<SchemeObject,(__gnu_cxx::_Lock_policy)2> *)&local_228,
                 &default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>);
      Context::set(&global_context,(string *)&x,&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::~string((string *)&x);
      std::__cxx11::string::string((string *)&x,"user-initial-environment",(allocator *)local_218);
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Context::set(&global_context,(string *)&x,&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::~string((string *)&x);
      Context::new_frame(&global_context);
      global_context.toplevel = true;
      std::__cxx11::string::string((string *)&x,"user-initial-environment",&local_229);
      std::make_shared<SchemeEnvironment,Context&>((Context *)local_218);
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_218._0_8_;
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
      local_218._0_8_ = (pointer)0x0;
      local_218._8_8_ = (_List_node_base *)0x0;
      Context::assign(&global_context,(string *)&x,&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
      std::__cxx11::string::~string((string *)&x);
      std::__cxx11::istringstream::~istringstream((istringstream *)&st);
      return;
    }
    if (x.result == ERROR) break;
    ASTNode::evaluate(&local_1d0,
                      x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &global_context);
    ExecutionResult::~ExecutionResult(&local_1d0);
    ParseResult::~ParseResult(&x);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Error during initialization: ");
  std::operator<<(poVar2,(string *)&x.error);
  exit(1);
}

Assistant:

void init_scheme()
{
    start_time = get_current_time();
    srand(time(0));
    current_input_port = default_port;
    current_output_port = default_port;
    global_context = Context();
    global_context.new_frame();
    global_context.toplevel = true;
    for(auto p : SpecialFormRegistry::all())
    {
        global_context.set(p.first, std::make_shared<SchemeSpecialForm>(p.first));
    }
    for(auto p : FunctionRegistry::all())
    {
        global_context.set(p.first, std::make_shared<SchemePrimitiveProcedure>(p.first,
                                                                               std::get<0>(p.second),
                                                                               std::get<1>(p.second)));
    }
    std::istringstream st;
    st.str(startup);
    while(1)
    {
        auto x = read_object(st);
        if(x.result == parse_result_t::END)
            break;
        if(x.result == parse_result_t::ERROR)
        {
            std::cout << "Error during initialization: " << x.error;
            exit(1);
        }
        x.node->evaluate(global_context);
    }
    global_context.set("console-i/o-port", default_port);
    global_context.set("user-initial-environment", nullptr);
    global_context.new_frame();
    global_context.toplevel = true;
    global_context.assign("user-initial-environment", std::make_shared<SchemeEnvironment>(global_context));
}